

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

size_t __thiscall
CoreML::Specification::SlidingWindowsLayerParams::ByteSizeLong(SlidingWindowsLayerParams *this)

{
  long lVar1;
  ulong uVar2;
  size_t sVar3;
  
  if (this->axis_ == 0) {
    sVar3 = 0;
  }
  else {
    uVar2 = this->axis_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = (ulong)((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->windowsize_ != 0) {
    uVar2 = this->windowsize_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  if (this->step_ != 0) {
    uVar2 = this->step_ | 1;
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    sVar3 = sVar3 + ((int)lVar1 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::google::protobuf::int64 SlidingWindowsLayerParams::axis() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.SlidingWindowsLayerParams.axis)
  return axis_;
}